

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VAbs_MultiFab(N_Vector x,N_Vector z)

{
  bool bVar1;
  MultiFab **ppMVar2;
  N_Vector in_RSI;
  N_Vector in_RDI;
  Array4<double> *z_fab;
  Array4<double> *x_fab;
  Box *bx;
  MFIter mfi;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_x;
  MFIter *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  MFIter *in_stack_fffffffffffffe40;
  uchar in_stack_fffffffffffffe57;
  FabArrayBase *in_stack_fffffffffffffe58;
  MFIter *in_stack_fffffffffffffe60;
  anon_class_128_2_bf24209b *in_stack_fffffffffffffe78;
  undefined1 auStack_180 [4];
  int in_stack_fffffffffffffe84;
  Box *in_stack_fffffffffffffe88;
  undefined1 local_140 [64];
  undefined1 *local_100;
  undefined1 local_f8 [64];
  undefined1 *local_b8;
  undefined1 local_ac [36];
  MFIter local_88;
  int local_24;
  MultiFab *local_20;
  FabArrayBase *local_18;
  N_Vector local_10;
  
  local_10 = in_RSI;
  ppMVar2 = amrex::sundials::getMFptr(in_RDI);
  local_18 = (FabArrayBase *)*ppMVar2;
  ppMVar2 = amrex::sundials::getMFptr(local_10);
  local_20 = *ppMVar2;
  local_24 = amrex::FabArrayBase::nComp(local_18);
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe57);
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_88);
    if (!bVar1) break;
    amrex::MFIter::validbox(in_stack_fffffffffffffe40);
    local_ac._28_8_ = local_ac;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30);
    local_b8 = local_f8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30);
    local_100 = local_140;
    in_stack_fffffffffffffe30 = (MFIter *)local_ac._28_8_;
    in_stack_fffffffffffffe3c = local_24;
    memcpy(&stack0xfffffffffffffe40,local_100,0x3c);
    memcpy(auStack_180,local_b8,0x3c);
    amrex::ParallelFor<int,N_VAbs_MultiFab::__0,void>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
    amrex::MFIter::operator++(&local_88);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void N_VAbs_MultiFab(N_Vector x, N_Vector z)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    MultiFab *mf_z = amrex::sundials::getMFptr(z);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi)
    {
         const amrex::Box& bx = mfi.validbox();
         Array4<Real> const& x_fab = mf_x->array(mfi);
         Array4<Real> const& z_fab = mf_z->array(mfi);

         amrex::ParallelFor(bx, ncomp,
         [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
         {
             z_fab(i,j,k,c) = SUNRabs(x_fab(i,j,k,c));
         });
    }
}